

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O2

void __thiscall AbstractTransaction_TxArray_Test::TestBody(AbstractTransaction_TxArray_Test *this)

{
  bool bVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  vector<cfd::core::AbstractTransaction_*,_std::allocator<cfd::core::AbstractTransaction_*>_>
  vector_info;
  TestTransaction tx;
  
  vector_info.
  super__Vector_base<cfd::core::AbstractTransaction_*,_std::allocator<cfd::core::AbstractTransaction_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vector_info.
  super__Vector_base<cfd::core::AbstractTransaction_*,_std::allocator<cfd::core::AbstractTransaction_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vector_info.
  super__Vector_base<cfd::core::AbstractTransaction_*,_std::allocator<cfd::core::AbstractTransaction_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TestTransaction::TestTransaction(&tx);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx
      ;
      std::vector<cfd::core::AbstractTransaction*,std::allocator<cfd::core::AbstractTransaction*>>::
      emplace_back<cfd::core::AbstractTransaction*>
                ((vector<cfd::core::AbstractTransaction*,std::allocator<cfd::core::AbstractTransaction*>>
                  *)&vector_info,(AbstractTransaction **)&local_48);
    }
  }
  else {
    testing::Message::Message((Message *)&local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x145,
               "Expected: (vector_info.push_back(&tx)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  cfd::core::AbstractTransaction::~AbstractTransaction(&tx.super_AbstractTransaction);
  std::
  _Vector_base<cfd::core::AbstractTransaction_*,_std::allocator<cfd::core::AbstractTransaction_*>_>
  ::~_Vector_base(&vector_info.
                   super__Vector_base<cfd::core::AbstractTransaction_*,_std::allocator<cfd::core::AbstractTransaction_*>_>
                 );
  return;
}

Assistant:

TEST(AbstractTransaction, AddTxIn_RemoveTxIn) {
  uint32_t txin_count = 2;
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  // script is not empty
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
          vout, seq,
          Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac")));

  // script is empty
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "0d0afd7c8e65545f877fa58905d3b50aa114ed885becd6c12232b1d494a7d597"),
          vout, seq, Script()));

  std::vector<TxInReference> list = tx.GetTxInList();
  EXPECT_STREQ(
      list[0].GetTxid().GetHex().c_str(),
      "e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6");
  EXPECT_STREQ(list[0].GetUnlockingScript().GetHex().c_str(),
               "76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac");
  EXPECT_EQ(list[0].GetVout(), vout);
  EXPECT_EQ(list[0].GetSequence(), seq);
  EXPECT_EQ(tx.GetTxInCount(), txin_count);

  // index error
  EXPECT_THROW(tx.RemoveTxIn(3), CfdException);
  // remove success
  EXPECT_NO_THROW(tx.RemoveTxIn(0));
  txin_count--;
  EXPECT_EQ(tx.GetTxInCount(), txin_count);
}